

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

IterateResult __thiscall glcts::ViewportArray::ScissorAPI::iterate(ScissorAPI *this)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  uint uVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  char *description;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  bool test_result;
  GLint max_viewports;
  vector<int,_std::allocator<int>_> scissor_box_data_b;
  vector<int,_std::allocator<int>_> scissor_box_data_a;
  bool local_6d;
  uint local_6c;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_viewport_array_supported != false) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar2);
    local_6d = true;
    local_6c = 0;
    (**(code **)(lVar5 + 0x868))(0x825b,&local_6c);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x797);
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize(&local_48,(ulong)(local_6c << 2));
    std::vector<int,_std::allocator<int>_>::resize(&local_68,(ulong)(local_6c << 2));
    getScissorBoxes(this,local_6c,&local_48);
    uVar9 = (ulong)local_6c;
    if (0 < (int)local_6c) {
      uVar4 = 3;
      lVar7 = 0;
      do {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 - 3] =
             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar4 - 3] + 1;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 - 2] =
             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar4 - 2] + 1;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 - 1] =
             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar4 - 1] + -1;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4] =
             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar4] + -1;
        lVar7 = lVar7 + 1;
        uVar9 = (ulong)(int)local_6c;
        uVar4 = uVar4 + 4;
      } while (lVar7 < (long)uVar9);
    }
    (**(code **)(lVar5 + 0x1298))
              (0,uVar9,local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"scissorArrayv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x7b0);
    getScissorBoxes(this,local_6c,&local_68);
    compareScissorBoxes(this,&local_48,&local_68,"scissorArrayv",&local_6d);
    if (0 < (int)local_6c) {
      uVar4 = 3;
      uVar9 = 0;
      do {
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 - 3] = 4;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 - 2] = 4;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 - 1] = 8;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4] = 8;
        (**(code **)(lVar5 + 0x12a0))(uVar9 & 0xffffffff,4,4,8,8);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"scissorIndexed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                        ,0x7c2);
        getScissorBoxes(this,local_6c,&local_48);
        compareScissorBoxes(this,&local_48,&local_68,"scissorIndexed",&local_6d);
        uVar9 = uVar9 + 1;
        uVar4 = uVar4 + 4;
      } while ((long)uVar9 < (long)(int)local_6c);
    }
    if (0 < (int)local_6c) {
      uVar4 = 3;
      uVar9 = 0;
      do {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 - 3] = 8;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 - 2] = 8;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 - 1] = 0xc;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4] = 0xc;
        (**(code **)(lVar5 + 0x12a8))(uVar9 & 0xffffffff);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"scissorIndexedv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                        ,0x7d5);
        getScissorBoxes(this,local_6c,&local_68);
        compareScissorBoxes(this,&local_48,&local_68,"scissorIndexedv",&local_6d);
        uVar9 = uVar9 + 1;
        uVar4 = uVar4 + 4;
      } while ((long)uVar9 < (long)(int)local_6c);
    }
    uVar4 = 7;
    uVar9 = 0;
    uVar11 = 0;
    while ((long)uVar11 < (long)(int)local_6c) {
      iVar2 = ((uint)uVar11 & 1) * 3 + 1;
      if (uVar11 != 0) {
        uVar8 = 0;
        do {
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar8 & 0xffffffff] = iVar2;
          iVar1 = (int)uVar8;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar1 + 1] = iVar2;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar1 + 2] = iVar2;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar1 + 3] = iVar2;
          uVar8 = uVar8 + 4;
        } while (uVar9 != uVar8);
      }
      uVar11 = uVar11 + 1;
      if ((int)uVar11 < (int)local_6c) {
        uVar8 = uVar11 & 0xffffffff;
        uVar6 = uVar4;
        do {
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar6 - 3] = iVar2;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar6 - 2] = iVar2;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar6 - 1] = iVar2;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar6] = iVar2;
          uVar10 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar10;
          uVar6 = uVar6 + 4;
        } while ((int)uVar10 < (int)local_6c);
      }
      (**(code **)(lVar5 + 0x1298))
                (0,local_6c,
                 local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"scissorArrayv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x7f5);
      getScissorBoxes(this,local_6c,&local_48);
      uVar9 = uVar9 + 4;
      uVar4 = uVar4 + 4;
      compareScissorBoxes(this,&local_48,&local_68,"scissorArrayv",&local_6d);
    }
    if (0 < (int)local_6c) {
      uVar4 = 3;
      lVar7 = 0;
      do {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 - 3] = 0;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 - 2] = 0;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 - 1] = 1;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4] = 1;
        lVar7 = lVar7 + 1;
        uVar4 = uVar4 + 4;
      } while (lVar7 < (int)local_6c);
    }
    (**(code **)(lVar5 + 0x1290))(0,0,1,1);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"scissor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x808);
    getScissorBoxes(this,local_6c,&local_68);
    compareScissorBoxes(this,&local_48,&local_68,"scissor",&local_6d);
    description = "Fail";
    if (local_6d != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              (((this->super_TestCaseBase).m_context)->m_testCtx,local_6d ^ QP_TEST_RESULT_FAIL,
               description);
    if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Viewport array functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x78b);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ScissorAPI::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result */
	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<GLint> scissor_box_data_a;
	std::vector<GLint> scissor_box_data_b;

	scissor_box_data_a.resize(max_viewports * m_n_elements);
	scissor_box_data_b.resize(max_viewports * m_n_elements);

	/*
	 *   - get initial dimensions of SCISSOR_BOX for all MAX_VIEWPORTS indices;
	 *   - change location and dimensions of all indices at once with
	 *   ScissorArrayv;
	 *   - get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	getScissorBoxes(max_viewports, scissor_box_data_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] += 1;
		scissor_box_data_a[i * m_n_elements + 1] += 1;
		scissor_box_data_a[i * m_n_elements + 2] -= 1;
		scissor_box_data_a[i * m_n_elements + 3] -= 1;
	}

	gl.scissorArrayv(0, max_viewports, &scissor_box_data_a[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "scissorArrayv");

	getScissorBoxes(max_viewports, scissor_box_data_b);
	compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorArrayv", test_result);

	/*
	 *   - for each index:
	 *     * modify with ScissorIndexed,
	 *     * get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_b[i * m_n_elements + 0] = 4;
		scissor_box_data_b[i * m_n_elements + 1] = 4;
		scissor_box_data_b[i * m_n_elements + 2] = 8;
		scissor_box_data_b[i * m_n_elements + 3] = 8;

		gl.scissorIndexed(i, 4, 4, 8, 8);
		GLU_EXPECT_NO_ERROR(gl.getError(), "scissorIndexed");

		getScissorBoxes(max_viewports, scissor_box_data_a);
		compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorIndexed", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify with ScissorIndexedv,
	 *     * get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 8;
		scissor_box_data_a[i * m_n_elements + 1] = 8;
		scissor_box_data_a[i * m_n_elements + 2] = 12;
		scissor_box_data_a[i * m_n_elements + 3] = 12;

		gl.scissorIndexedv(i, &scissor_box_data_a[i * m_n_elements]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "scissorIndexedv");

		getScissorBoxes(max_viewports, scissor_box_data_b);
		compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorIndexedv", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify all indices before and after current one with ScissorArrayv,
	 *     * get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		const GLint value = (0 == i % 2) ? 1 : 4;

		for (GLint j = 0; j < i; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		for (GLint j = i + 1; j < max_viewports; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		gl.scissorArrayv(0, max_viewports, &scissor_box_data_b[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "scissorArrayv");

		getScissorBoxes(max_viewports, scissor_box_data_a);
		compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorArrayv", test_result);
	}

	/*
	 *   - change location and dimensions of all indices at once with Scissor;
	 *   - get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 0;
		scissor_box_data_a[i * m_n_elements + 1] = 0;
		scissor_box_data_a[i * m_n_elements + 2] = 1;
		scissor_box_data_a[i * m_n_elements + 3] = 1;
	}

	gl.scissor(0, 0, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "scissor");

	getScissorBoxes(max_viewports, scissor_box_data_b);
	compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissor", test_result);

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}